

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O2

void float32_suite::test_min(void)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  encoder_type encoder;
  undefined8 local_68;
  undefined4 local_5c;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_58;
  undefined **local_38 [5];
  
  local_38[1] = (undefined **)&local_58;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38[0] = &PTR__base_00112ca8;
  local_68 = trial::protocol::bintoken::detail::basic_encoder<24UL>::value
                       ((basic_encoder<24UL> *)local_38,1.1754944e-38);
  local_5c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.value(std::numeric_limits<token::float32::type>::min())","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x224,"void float32_suite::test_min()",&local_68,&local_5c);
  local_68 = (long)local_58._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58._M_impl.super__Vector_impl_data._M_start;
  local_5c = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("buffer.size()","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x225,"void float32_suite::test_min()",&local_68,&local_5c);
  local_68._0_4_ = 0xc5;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,unsigned_char,trial::protocol::bintoken::token::code::value>
            ("buffer[0]","token::code::float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x226,"void float32_suite::test_min()",
             local_58._M_impl.super__Vector_impl_data._M_start,&local_68);
  local_68._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[1]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x227,"void float32_suite::test_min()",
             local_58._M_impl.super__Vector_impl_data._M_start + 1,&local_68);
  local_68._0_4_ = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[2]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x228,"void float32_suite::test_min()",
             local_58._M_impl.super__Vector_impl_data._M_start + 2,&local_68);
  local_68._0_4_ = 0x80;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[3]","0x80",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x229,"void float32_suite::test_min()",
             local_58._M_impl.super__Vector_impl_data._M_start + 3,&local_68);
  local_68 = (ulong)local_68._4_4_ << 0x20;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_char,int>
            ("buffer[4]","0x00",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/encoder_suite.cpp"
             ,0x22a,"void float32_suite::test_min()",
             local_58._M_impl.super__Vector_impl_data._M_start + 4,&local_68);
  (*(code *)*local_38[0])();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void test_zero()
{
    std::vector<output_type> buffer;
    encoder_type encoder(buffer);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.value(std::int8_t(0)), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer.size(), 1);
    TRIAL_PROTOCOL_TEST_EQUAL(buffer[0], 0x00);
}